

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O1

void __thiscall
BRTS_XZ<TTA>::FindRuns(BRTS_XZ<TTA> *this,uint64_t *bits_start,int height,int data_width,Run *runs)

{
  ulong *puVar1;
  ushort uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  Run *pRVar6;
  short sVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong *puVar11;
  Run *pRVar12;
  ulong uVar13;
  Run *pRVar14;
  ulong *puVar15;
  Run *pRVar16;
  unsigned_short uVar17;
  short sVar18;
  uint64_t *puVar19;
  long lVar20;
  unsigned_short uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  Run *local_88;
  
  puVar5 = TTA::tail_;
  puVar4 = TTA::next_;
  puVar3 = TTA::rtable_;
  lVar10 = (long)data_width;
  uVar13 = *bits_start;
  sVar18 = 0;
  puVar19 = bits_start;
  local_88 = runs;
  do {
    lVar24 = 0;
    if (uVar13 != 0) {
      for (; (uVar13 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
      }
    }
    sVar7 = (short)lVar24;
    if (uVar13 == 0) {
      do {
        puVar19 = puVar19 + 1;
        if (puVar19 == bits_start + lVar10) {
          local_88->start_pos = 0xffff;
          local_88->end_pos = 0xffff;
          if (height < 2) {
LAB_00229aff:
            puVar3 = TTA::rtable_;
            uVar9 = 1;
            if (1 < TTA::length_) {
              uVar13 = 1;
              do {
                if (uVar13 == puVar3[uVar13]) {
                  uVar9 = uVar9 + 1;
                  uVar8 = uVar9;
                }
                else {
                  uVar8 = puVar3[puVar3[uVar13]];
                }
                puVar3[uVar13] = uVar8;
                uVar13 = uVar13 + 1;
              } while (uVar13 < TTA::length_);
            }
            (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
            return;
          }
          uVar13 = 1;
LAB_0022991a:
          pRVar12 = local_88 + 1;
          puVar15 = bits_start + uVar13 * lVar10;
          puVar11 = puVar15 + lVar10;
          uVar25 = *puVar15;
          lVar24 = 0;
          local_88 = pRVar12;
          do {
            lVar22 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
              }
            }
            lVar23 = lVar24;
            if (uVar25 == 0) {
              do {
                puVar15 = puVar15 + 1;
                if (puVar15 == puVar11) {
                  local_88->start_pos = 0xffff;
                  local_88->end_pos = 0xffff;
                  uVar13 = uVar13 + 1;
                  runs = pRVar12;
                  if (uVar13 != (uint)height) goto LAB_0022991a;
                  goto LAB_00229aff;
                }
                lVar23 = lVar24 + 0x40;
                uVar25 = *puVar15;
                lVar22 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                  }
                }
                lVar24 = lVar23;
              } while (uVar25 == 0);
            }
            uVar25 = (~uVar25 >> ((byte)lVar22 & 0x3f)) << ((byte)lVar22 & 0x3f);
            lVar20 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            lVar24 = lVar23;
            if (uVar25 == 0) {
              do {
                lVar24 = lVar24 + 0x40;
                puVar1 = puVar15 + 1;
                puVar15 = puVar15 + 1;
                uVar25 = ~*puVar1;
                lVar20 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                  }
                }
              } while (*puVar1 == 0xffffffffffffffff);
            }
            uVar21 = (unsigned_short)(lVar22 + lVar23);
            pRVar6 = runs + -1;
            pRVar16 = runs;
            do {
              pRVar14 = pRVar6;
              pRVar16 = pRVar16 + 1;
              uVar2 = pRVar14[1].end_pos;
              runs = pRVar14 + 1;
              pRVar6 = runs;
            } while ((uint)uVar2 < ((uint)(lVar22 + lVar23) & 0xffff));
            uVar17 = (unsigned_short)(lVar20 + lVar24);
            uVar9 = (uint)(lVar20 + lVar24) & 0xffff;
            if (uVar9 < runs->start_pos) {
              local_88->start_pos = uVar21;
              local_88->end_pos = uVar17;
              TTA::rtable_[TTA::length_] = TTA::length_;
              TTA::next_[TTA::length_] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar8 = TTA::length_;
              TTA::length_ = TTA::length_ + 1;
            }
            else {
              uVar8 = TTA::rtable_[pRVar14[1].label];
              for (; (uVar2 < uVar9 && (runs = pRVar16, pRVar16->start_pos <= uVar9));
                  pRVar16 = pRVar16 + 1) {
                if (uVar8 != TTA::rtable_[pRVar16->label]) {
                  uVar8 = TTA::Merge(uVar8,TTA::rtable_[pRVar16->label]);
                }
                uVar2 = pRVar16->end_pos;
              }
              local_88->start_pos = uVar21;
              local_88->end_pos = uVar17;
            }
            uVar25 = ~uVar25 & -1L << ((byte)lVar20 & 0x3f);
            local_88->label = uVar8;
            local_88 = local_88 + 1;
          } while( true );
        }
        sVar18 = sVar18 + 0x40;
        uVar13 = *puVar19;
        lVar24 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
          }
        }
        sVar7 = (short)lVar24;
      } while (uVar13 == 0);
    }
    uVar13 = (~uVar13 >> ((byte)sVar7 & 0x3f)) << ((byte)sVar7 & 0x3f);
    local_88->start_pos = sVar7 + sVar18;
    lVar24 = 0;
    if (uVar13 != 0) {
      for (; (uVar13 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
      }
    }
    sVar7 = (short)lVar24;
    if (uVar13 == 0) {
      do {
        sVar18 = sVar18 + 0x40;
        puVar15 = puVar19 + 1;
        puVar19 = puVar19 + 1;
        uVar13 = ~*puVar15;
        lVar24 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
          }
        }
        sVar7 = (short)lVar24;
      } while (*puVar15 == 0xffffffffffffffff);
    }
    uVar13 = (~uVar13 >> ((byte)sVar7 & 0x3f)) << ((byte)sVar7 & 0x3f);
    local_88->end_pos = sVar7 + sVar18;
    puVar3[TTA::length_] = TTA::length_;
    puVar4[TTA::length_] = 0xffffffff;
    puVar5[TTA::length_] = TTA::length_;
    uVar9 = TTA::length_ + 1;
    local_88->label = TTA::length_;
    TTA::length_ = uVar9;
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

void FindRuns(const uint64_t* bits_start, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);

            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::NewLabel();
        }
    out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;
            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this run starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::NewLabel();
                    continue;
                };

                unsigned label = LabelsSolver::GetLabel(runs_up->label);

                //Next upper run can not meet this
                if (end_pos <= runs_up->end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = label;
                    continue;
                }

                //Find next upper runs meet this
                runs_up++;
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                    if (label != label_other) label = LabelsSolver::Merge(label, label_other);
                    if (end_pos <= runs_up->end_pos) break;
                }
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
                runs->label = label;
            }

        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::Flatten();
    }